

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

Abc_Cex_t * Abc_CexTransformTempor(Abc_Cex_t *p,int nPisOld,int nPosOld,int nRegsOld)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  iVar1 = p->nPis / nPisOld;
  if (p->iFrame < 1) {
    __assert_fail("p->iFrame > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                  ,0x1a4,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  if (p->nPis % nPisOld != 0) {
    __assert_fail("p->nPis % nPisOld == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                  ,0x1a5,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  iVar9 = iVar1 + -1;
  pAVar2 = Abc_CexAlloc(nRegsOld,nPisOld,p->iFrame + iVar1);
  pAVar2->iPo = p->iPo;
  iVar1 = p->iFrame;
  pAVar2->iFrame = iVar1 + iVar9;
  iVar5 = 0;
  iVar4 = 0;
  if (0 < nPisOld) {
    iVar4 = nPisOld;
  }
  iVar6 = nPisOld;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  while (iVar5 != iVar9) {
    iVar5 = iVar5 + 1;
    iVar7 = iVar6;
    iVar8 = iVar4;
    while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
      uVar3 = p->nRegs + iVar7;
      if (((uint)(&p[1].iPo)[(int)uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0) {
        (&pAVar2[1].iPo)[nRegsOld >> 5] =
             (&pAVar2[1].iPo)[nRegsOld >> 5] | 1 << ((byte)nRegsOld & 0x1f);
      }
      nRegsOld = nRegsOld + 1;
      iVar7 = iVar7 + 1;
    }
    iVar6 = iVar6 + nPisOld;
  }
  for (iVar5 = 0; iVar5 <= iVar1; iVar5 = iVar5 + 1) {
    for (iVar9 = 0; iVar6 = nRegsOld + iVar9, iVar4 != iVar9; iVar9 = iVar9 + 1) {
      uVar3 = p->nPis * iVar5 + p->nRegs + iVar9;
      if (((uint)(&p[1].iPo)[(int)uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0) {
        (&pAVar2[1].iPo)[iVar6 >> 5] = (&pAVar2[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
      }
    }
    nRegsOld = iVar6;
  }
  if (nRegsOld != pAVar2->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                  ,0x1b1,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  return pAVar2;
}

Assistant:

Abc_Cex_t * Abc_CexTransformTempor( Abc_Cex_t * p, int nPisOld, int nPosOld, int nRegsOld )
{
    Abc_Cex_t * pCex;
    int i, k, iBit = nRegsOld, nFrames = p->nPis / nPisOld - 1;
    assert( p->iFrame > 0 ); // otherwise tempor did not properly check for failures in the prefix
    assert( p->nPis % nPisOld == 0 );
    pCex = Abc_CexAlloc( nRegsOld, nPisOld, nFrames + p->iFrame + 1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = nFrames + p->iFrame;
    for ( i = 0; i < nFrames; i++ )
        for ( k = 0; k < nPisOld; k++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + (i+1)*nPisOld + k) )
                Abc_InfoSetBit( pCex->pData, iBit );
    for ( i = 0; i <= p->iFrame; i++ )
        for ( k = 0; k < nPisOld; k++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + i*p->nPis + k) )
                Abc_InfoSetBit( pCex->pData, iBit );
    assert( iBit == pCex->nBits );
    return pCex;
}